

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O1

void Diligent::GLSLangUtils::anon_unknown_3::LogCompilerError
               (char *DebugOutputMessage,char *InfoLog,char *InfoDebugLog,char *ShaderSource,
               size_t SourceCodeLen,IDataBlob **ppCompilerOutput)

{
  void *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1;
  string _msg;
  string ErrorLog;
  undefined1 local_68 [32];
  IMemoryAllocator *local_48;
  long local_40;
  IMemoryAllocator local_38 [2];
  pointer local_28;
  
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ShaderSource;
  local_28 = (pointer)DebugOutputMessage;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,InfoLog,(allocator<char> *)local_68);
  if (*InfoDebugLog != '\0') {
    std::__cxx11::string::push_back((char)&local_48);
    std::__cxx11::string::append((char *)&local_48);
  }
  FormatString<char_const*,std::__cxx11::string>
            ((string *)local_68,(Diligent *)&local_28,(char **)&local_48,Args_1);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,local_68._0_8_,0,0,0);
  }
  if ((DataBlobImpl *)local_68._0_8_ != (DataBlobImpl *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (ppCompilerOutput != (IDataBlob **)0x0) {
    DataBlobImpl::Create((DataBlobImpl *)local_68,local_40 + SourceCodeLen + 2,(void *)0x0);
    __dest = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_68._0_8_,0);
    memcpy(__dest,local_48,local_40 + 1);
    memcpy((void *)((long)__dest + local_40 + 1),ShaderSource,SourceCodeLen + 1);
    DataBlobImpl::QueryInterface
              ((DataBlobImpl *)local_68._0_8_,(INTERFACE_ID *)IID_DataBlob,
               (IObject **)ppCompilerOutput);
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,(ulong)((long)local_38[0]._vptr_IMemoryAllocator + 1));
  }
  return;
}

Assistant:

void LogCompilerError(const char* DebugOutputMessage,
                      const char* InfoLog,
                      const char* InfoDebugLog,
                      const char* ShaderSource,
                      size_t      SourceCodeLen,
                      IDataBlob** ppCompilerOutput)
{
    std::string ErrorLog(InfoLog);
    if (*InfoDebugLog != '\0')
    {
        ErrorLog.push_back('\n');
        ErrorLog.append(InfoDebugLog);
    }
    LOG_ERROR_MESSAGE(DebugOutputMessage, ErrorLog);

    if (ppCompilerOutput != nullptr)
    {
        auto  pOutputDataBlob = DataBlobImpl::Create(SourceCodeLen + 1 + ErrorLog.length() + 1);
        char* DataPtr         = pOutputDataBlob->GetDataPtr<char>();
        memcpy(DataPtr, ErrorLog.data(), ErrorLog.length() + 1);
        memcpy(DataPtr + ErrorLog.length() + 1, ShaderSource, SourceCodeLen + 1);
        pOutputDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppCompilerOutput));
    }
}